

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
OpenTypePrimitiveReader::Read
          (OpenTypePrimitiveReader *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  EStatusCode status;
  LongBufferSizeType inBufferSize_local;
  Byte *inBuffer_local;
  OpenTypePrimitiveReader *this_local;
  
  if (this->mInternalState == eFailure) {
    this_local._4_4_ = eFailure;
  }
  else {
    iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mOpenTypeFile,inBuffer,inBufferSize);
    this_local._4_4_ = eFailure;
    if (CONCAT44(extraout_var,iVar1) == inBufferSize) {
      this_local._4_4_ = eSuccess;
    }
    if (this_local._4_4_ == eFailure) {
      this->mInternalState = eFailure;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::Read(Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mOpenTypeFile->Read(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}